

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayGenericFold<double,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *count;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  unsigned_long *puVar6;
  pointer pcVar7;
  BoundFunctionExpression *pBVar8;
  reference pvVar9;
  Vector *vector;
  Vector *vector_00;
  idx_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  InvalidInputException *pIVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  idx_t iVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx;
  long lVar16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_178;
  double local_158;
  double dStack_150;
  string local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  count = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args->count;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector = ArrayVector::GetEntry(pvVar9);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar9);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar9,(idx_t)count,&local_78);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar9,(idx_t)count,&local_c0);
  pdVar3 = vector->data;
  pdVar4 = vector_00->data;
  pdVar5 = result->data;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  iVar10 = ArrayType::GetSize(&pvVar9->type);
  if (count != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar11 = idx;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_78.sel)->sel_vector[(long)idx];
      }
      pbVar14 = idx;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_c0.sel)->sel_vector[(long)idx];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar11 >> 6] >> ((ulong)pbVar11 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar14 >> 6] >> ((ulong)pbVar14 & 0x3f) & 1) != 0)))) {
        uVar12 = (long)pbVar11 * iVar10;
        puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar6 != (unsigned_long *)0x0) {
          bVar19 = uVar12 + iVar10 <= uVar12;
          if ((!bVar19) &&
             (lVar16 = iVar10 - 1, uVar17 = uVar12,
             (puVar6[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)) {
            do {
              uVar17 = uVar17 + 1;
              if (lVar16 == 0) break;
              lVar16 = lVar16 + -1;
            } while ((puVar6[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0);
            bVar19 = uVar12 + iVar10 <= uVar17;
          }
          if (!bVar19) {
            pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_e0[0] = local_d0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"%s: left argument can not contain NULL values","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            pcVar7 = (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.super_Function
                     .name._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,pcVar7,
                       pcVar7 + (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_178,(StringUtil *)local_e0,&local_100,pbVar14);
            InvalidInputException::InvalidInputException(pIVar13,&local_178);
            __cxa_throw(pIVar13,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar14 * iVar10);
        puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar6 != (unsigned_long *)0x0) {
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar14->_M_dataplus)._M_p + iVar10);
          bVar19 = pbVar11 <= pbVar14;
          if ((!bVar19) &&
             (lVar16 = iVar10 - 1, pbVar18 = pbVar14,
             (puVar6[(ulong)pbVar14 >> 6] >> ((ulong)pbVar14 & 0x3f) & 1) != 0)) {
            do {
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar18->_M_dataplus)._M_p + 1);
              if (lVar16 == 0) break;
              lVar16 = lVar16 + -1;
            } while ((puVar6[(ulong)pbVar18 >> 6] >> ((ulong)pbVar18 & 0x3f) & 1) != 0);
            bVar19 = pbVar11 <= pbVar18;
          }
          if (!bVar19) {
            pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_120[0] = local_110;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"%s: right argument can not contain NULL values","");
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            pcVar7 = (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.super_Function
                     .name._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,pcVar7,
                       pcVar7 + (pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_178,(StringUtil *)local_120,&local_140,pbVar14);
            InvalidInputException::InvalidInputException(pIVar13,&local_178);
            __cxa_throw(pIVar13,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
        if (iVar10 == 0) {
          dVar21 = 0.0;
          dVar22 = 0.0;
          dVar20 = 0.0;
        }
        else {
          dVar21 = 0.0;
          dVar22 = 0.0;
          dVar20 = 0.0;
          iVar15 = 0;
          do {
            dVar1 = *(double *)(pdVar4 + iVar15 * 8 + (long)pbVar14 * 8);
            dVar2 = *(double *)(pdVar3 + iVar15 * 8 + uVar12 * 8);
            dVar21 = dVar21 + dVar2 * dVar1;
            dVar22 = dVar22 + dVar2 * dVar2;
            dVar20 = dVar20 + dVar1 * dVar1;
            iVar15 = iVar15 + 1;
          } while (iVar10 != iVar15);
          dVar20 = dVar22 * dVar20;
        }
        if (dVar20 < 0.0) {
          local_158 = dVar21;
          dStack_150 = dVar22;
          dVar20 = sqrt(dVar20);
          dVar21 = local_158;
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar22 = 1.0;
        if (dVar21 / dVar20 <= 1.0) {
          dVar22 = dVar21 / dVar20;
        }
        if (dVar22 <= -1.0) {
          dVar22 = -1.0;
        }
        *(double *)(pdVar5 + (long)idx * 8) = dVar22;
      }
      else {
        FlatVector::SetNull(result,(idx_t)idx,true);
      }
      idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(idx->_M_dataplus)._M_p + 1);
    } while (idx != count);
    if (count == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001)
    {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}